

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

QList<QFontDatabase::WritingSystem> *
QFontDatabase::writingSystems
          (QList<QFontDatabase::WritingSystem> *__return_storage_ptr__,QString *family)

{
  Type *pTVar1;
  QtFontFamily *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  QDeadlineTimer QVar4;
  QString local_78;
  QString local_58;
  WritingSystem local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (char16_t *)0x0;
  local_78.d.size = 0;
  parseFontName(family,&local_78,&local_58);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
                       *)family);
  if (pTVar1 != (Type *)0x0) {
    QVar4.t2 = 0xffffffff;
    QVar4.type = 0x7fffffff;
    QVar4.t1 = (qint64)pTVar1;
    QRecursiveMutex::tryLock(QVar4);
  }
  QFontDatabasePrivate::ensureFontDatabase();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (WritingSystem *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pQVar2 = QFontDatabasePrivate::family
                     (&QFontDatabasePrivate::instance::instance,&local_58,EnsurePopulated);
  if ((pQVar2 != (QtFontFamily *)0x0) && (pQVar2->count != 0)) {
    lVar3 = 0;
    do {
      if ((pQVar2->writingSystems[lVar3 + 1] & 1) != 0) {
        local_34 = (int)lVar3 + Latin;
        QtPrivate::QPodArrayOps<QFontDatabase::WritingSystem>::
        emplace<QFontDatabase::WritingSystem&>
                  ((QPodArrayOps<QFontDatabase::WritingSystem> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_34);
        QList<QFontDatabase::WritingSystem>::end(__return_storage_ptr__);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x21);
  }
  if (pTVar1 != (Type *)0x0) {
    QRecursiveMutex::unlock();
  }
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QFontDatabase::WritingSystem> QFontDatabase::writingSystems(const QString &family)
{
    QString familyName, foundryName;
    parseFontName(family, foundryName, familyName);

    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    QList<WritingSystem> list;
    QtFontFamily *f = d->family(familyName);
    if (!f || f->count == 0)
        return list;

    for (int x = Latin; x < WritingSystemsCount; ++x) {
        const WritingSystem writingSystem = WritingSystem(x);
        if (f->writingSystems[writingSystem] & QtFontFamily::Supported)
            list.append(writingSystem);
    }
    return list;
}